

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O3

FILE * open_file(char *name,char *mode)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  char testname [256];
  char acStack_128 [264];
  
  pFVar2 = fopen(name,mode);
  if (pFVar2 == (FILE *)0x0) {
    if (0 < incpathCount) {
      lVar6 = 0;
      piVar4 = str_offset;
      pcVar5 = incpath;
      iVar1 = incpathCount;
      do {
        if (pcVar5[piVar4[lVar6]] != '\0') {
          strcpy(acStack_128,pcVar5 + piVar4[lVar6]);
          sVar3 = strlen(acStack_128);
          (acStack_128 + sVar3)[0] = '/';
          (acStack_128 + sVar3)[1] = '\0';
          strcat(acStack_128,name);
          pFVar2 = fopen(acStack_128,mode);
          piVar4 = str_offset;
          pcVar5 = incpath;
          iVar1 = incpathCount;
          if (pFVar2 != (FILE *)0x0) {
            return (FILE *)pFVar2;
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar1);
    }
    pFVar2 = (FILE *)0x0;
  }
  return (FILE *)pFVar2;
}

Assistant:

FILE *
open_file(char *name, char *mode)
{
	FILE 	*fileptr;
	char	testname[256];
	int	i;

	fileptr = fopen(name, mode);
	if (fileptr != NULL) return(fileptr);

	for (i = 0; i < incpathCount; ++i) {
		if (strlen(incpath+str_offset[i])) {
			strcpy(testname, incpath+str_offset[i]);
			strcat(testname, PATH_SEPARATOR_STRING);
			strcat(testname, name);
		
			fileptr = fopen(testname, mode);
			if (fileptr != NULL) break;
		}
	}

	return (fileptr);
}